

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureLoad
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd,Uint32 ArrayDim)

{
  TokenListType *this_00;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Args_1;
  _List_node_base *extraout_RAX;
  _List_node_base *extraout_RAX_00;
  _List_node_base *p_Var1;
  undefined8 uVar2;
  uint uVar3;
  const_iterator cVar4;
  uint uVar5;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> Pos;
  string err;
  undefined1 local_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  size_t local_1b0;
  iterator *local_1a8;
  const_iterator local_1a0;
  undefined8 local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  String local_50;
  
  cVar4._M_node = Token->_M_node;
  uVar3 = ArrayDim + 1;
  local_1a8 = Token;
  if (uVar3 == 0) {
    Pos._M_node = cVar4._M_node;
    local_1a0._M_node = ScopeEnd->_M_node;
    local_198 = CONCAT71((int7)((ulong)ScopeEnd->_M_node >> 8),1);
LAB_002ce670:
    local_90 = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"imageLoad","");
    std::__cxx11::string::string
              ((string *)&local_70,(char *)local_1a8->_M_node[3]._M_prev,(allocator *)&local_50);
    local_1f8._0_4_ = 0x13b;
    if (local_90 == &local_80) {
      local_1e0._8_8_ = local_80._8_8_;
      local_1f8._8_8_ = &local_1e0;
    }
    else {
      local_1f8._8_8_ = local_90;
    }
    local_1e0._M_allocated_capacity._1_7_ = local_80._M_allocated_capacity._1_7_;
    local_1e0._M_local_buf[0] = local_80._M_local_buf[0];
    this_00 = &this->m_Tokens;
    local_1f8._16_8_ = local_88;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    if (local_70 == &local_60) {
      local_1c0._8_8_ = local_60._8_8_;
      local_1d0._M_p = (pointer)&local_1c0;
    }
    else {
      local_1d0._M_p = (pointer)local_70;
    }
    local_1c0._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
    local_1c0._M_local_buf[0] = local_60._M_local_buf[0];
    local_1c8 = local_68;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_1b0 = 0xffffffffffffffff;
    local_90 = &local_80;
    local_70 = &local_60;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar4,(HLSLTokenInfo *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._8_8_ != &local_1e0) {
      operator_delete((void *)local_1f8._8_8_,local_1e0._0_8_ + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(local_60._M_allocated_capacity._1_7_,
                                        local_60._M_local_buf[0]) + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(local_80._M_allocated_capacity._1_7_,
                                        local_80._M_local_buf[0]) + 1);
    }
    cVar4._M_node = local_1a8->_M_node;
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"(","");
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
    local_1f8._0_4_ = 0x135;
    if (local_b0 == &local_a0) {
      local_1e0._8_8_ = local_a0._8_8_;
      local_1f8._8_8_ = &local_1e0;
    }
    else {
      local_1f8._8_8_ = local_b0;
    }
    local_1e0._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
    local_1e0._M_local_buf[0] = local_a0._M_local_buf[0];
    local_1f8._16_8_ = local_a8;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    if (local_d0 == &local_c0) {
      local_1c0._8_8_ = local_c0._8_8_;
      local_1d0._M_p = (pointer)&local_1c0;
    }
    else {
      local_1d0._M_p = (pointer)local_d0;
    }
    local_1c0._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
    local_1c0._M_local_buf[0] = local_c0._M_local_buf[0];
    local_1c8 = local_c8;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_1b0 = 0xffffffffffffffff;
    local_d0 = &local_c0;
    local_b0 = &local_a0;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,cVar4,(HLSLTokenInfo *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._8_8_ != &local_1e0) {
      operator_delete((void *)local_1f8._8_8_,local_1e0._0_8_ + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                        local_c0._M_local_buf[0]) + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                        local_a0._M_local_buf[0]) + 1);
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_1a8->_M_node[3]._M_prev,0,(char *)local_1a8->_M_node[4]._M_next,
               0x7b8035);
    local_f0 = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,",","");
    local_110 = &local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
    local_1f8._0_4_ = 0x13f;
    if (local_f0 == &local_e0) {
      local_1e0._8_8_ = local_e0._8_8_;
      local_1f8._8_8_ = &local_1e0;
    }
    else {
      local_1f8._8_8_ = local_f0;
    }
    local_1e0._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
    local_1e0._M_local_buf[0] = local_e0._M_local_buf[0];
    local_1f8._16_8_ = local_e8;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    if (local_110 == &local_100) {
      local_1c0._8_8_ = local_100._8_8_;
      local_1d0._M_p = (pointer)&local_1c0;
    }
    else {
      local_1d0._M_p = (pointer)local_110;
    }
    local_1c0._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_1c0._M_local_buf[0] = local_100._M_local_buf[0];
    local_1c8 = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_1b0 = 0xffffffffffffffff;
    local_110 = &local_100;
    local_f0 = &local_e0;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    emplace<Diligent::Parsing::HLSLTokenInfo>
              (this_00,(const_iterator)Pos._M_node,(HLSLTokenInfo *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._8_8_ != &local_1e0) {
      operator_delete((void *)local_1f8._8_8_,local_1e0._0_8_ + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,
                      CONCAT71(local_100._M_allocated_capacity._1_7_,local_100._M_local_buf[0]) + 1)
      ;
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                        local_e0._M_local_buf[0]) + 1);
    }
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"_ToIvec","");
    local_150 = &local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150," ","");
    local_1f8._0_4_ = 0x13b;
    if (local_130 == &local_120) {
      local_1e0._8_8_ = local_120._8_8_;
      local_1f8._8_8_ = &local_1e0;
    }
    else {
      local_1f8._8_8_ = local_130;
    }
    local_1e0._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
    local_1e0._M_local_buf[0] = local_120._M_local_buf[0];
    local_1f8._16_8_ = local_128;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    if (local_150 == &local_140) {
      local_1c0._8_8_ = local_140._8_8_;
      local_1d0._M_p = (pointer)&local_1c0;
    }
    else {
      local_1d0._M_p = (pointer)local_150;
    }
    local_1c0._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
    local_1c0._M_local_buf[0] = local_140._M_local_buf[0];
    local_1c8 = local_148;
    local_148 = 0;
    local_140._M_local_buf[0] = '\0';
    local_1b0 = 0xffffffffffffffff;
    local_150 = &local_140;
    local_130 = &local_120;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    emplace<Diligent::Parsing::HLSLTokenInfo>
              (this_00,(const_iterator)Pos._M_node,(HLSLTokenInfo *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._8_8_ != &local_1e0) {
      operator_delete((void *)local_1f8._8_8_,local_1e0._0_8_ + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,
                      CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) + 1)
      ;
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,
                      CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0]) + 1)
      ;
    }
    *(undefined4 *)&Pos._M_node[1]._M_next = 0x135;
    std::__cxx11::string::_M_replace
              ((ulong)&Pos._M_node[1]._M_prev,0,(char *)Pos._M_node[2]._M_next,0x6b3b91);
    local_170 = &local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,")","");
    local_190 = &local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"");
    local_1f8._0_4_ = 0x136;
    if (local_170 == &local_160) {
      local_1e0._8_8_ = local_160._8_8_;
      local_1f8._8_8_ = &local_1e0;
    }
    else {
      local_1f8._8_8_ = local_170;
    }
    local_1e0._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
    local_1e0._M_local_buf[0] = local_160._M_local_buf[0];
    local_1f8._16_8_ = local_168;
    local_168 = 0;
    local_160._M_local_buf[0] = '\0';
    if (local_190 == &local_180) {
      local_1c0._8_8_ = local_180._8_8_;
      local_1d0._M_p = (pointer)&local_1c0;
    }
    else {
      local_1d0._M_p = (pointer)local_190;
    }
    local_1c0._M_allocated_capacity._1_7_ = local_180._M_allocated_capacity._1_7_;
    local_1c0._M_local_buf[0] = local_180._M_local_buf[0];
    local_1c8 = local_188;
    local_188 = 0;
    local_180._M_local_buf[0] = '\0';
    local_1b0 = 0xffffffffffffffff;
    local_190 = &local_180;
    local_170 = &local_160;
    std::__cxx11::
    list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
    emplace<Diligent::Parsing::HLSLTokenInfo>(this_00,local_1a0,(HLSLTokenInfo *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._8_8_ != &local_1e0) {
      operator_delete((void *)local_1f8._8_8_,local_1e0._0_8_ + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,
                      CONCAT71(local_180._M_allocated_capacity._1_7_,local_180._M_local_buf[0]) + 1)
      ;
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,
                      CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1)
      ;
    }
    *(undefined4 *)&local_1a0._M_node[1]._M_next = 0x136;
    std::__cxx11::string::_M_replace
              ((ulong)&local_1a0._M_node[1]._M_prev,0,(char *)local_1a0._M_node[2]._M_next,0x73bf31)
    ;
    local_1a8->_M_node = Pos._M_node;
    uVar2 = local_198;
  }
  else {
    Pos._M_node = (cVar4._M_node)->_M_next;
    if (Pos._M_node == ScopeEnd->_M_node) {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      local_198 = CONCAT44(local_198._4_4_,uVar3);
      uVar5 = 0;
      do {
        if (*(int *)&Pos._M_node[1]._M_next != 0x137) break;
        local_1f8._0_8_ =
             (this->m_Tokens).
             super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        Args_1 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                           ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)local_1f8,ScopeEnd,
                            Pos);
        p_Var1 = local_1a8->_M_node;
        if (p_Var1 == ScopeEnd->_M_node) {
          local_1a0._M_node = Pos._M_node;
          FormatString<char[47]>
                    ((string *)local_1f8,
                     (char (*) [47])"Unable to find matching closing square bracket");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_50,this,local_1a8,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessRWTextureLoad",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x83f,(string *)local_1f8,(char (*) [2])0x6d28c5,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          p_Var1 = (_List_node_base *)(local_1f8 + 0x10);
          if ((_List_node_base *)local_1f8._0_8_ != p_Var1) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            p_Var1 = extraout_RAX;
          }
          Pos._M_node = local_1a0._M_node;
          uVar3 = (uint)local_198;
        }
        if (*(int *)&Args_1._M_node[1]._M_next != 0x138) {
          FormatString<char[26],char[60]>
                    ((string *)local_1f8,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"ClosingStapleToken->Type == TokenType::ClosingSquareBracket",
                     (char (*) [60])Args_1._M_node);
          DebugAssertionFailed
                    ((Char *)local_1f8._0_8_,"ProcessRWTextureLoad",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x844);
          p_Var1 = (_List_node_base *)(local_1f8 + 0x10);
          if ((_List_node_base *)local_1f8._0_8_ != p_Var1) {
            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            p_Var1 = extraout_RAX_00;
          }
        }
        uVar2 = CONCAT71((int7)((ulong)p_Var1 >> 8),uVar3 <= uVar5 + 1);
        if (uVar5 < ArrayDim) {
          Pos = Args_1;
        }
        if (uVar5 == ArrayDim) {
          cVar4._M_node = local_1a8->_M_node;
          local_1a0._M_node = Args_1._M_node;
          local_198 = uVar2;
          goto LAB_002ce670;
        }
        Pos._M_node = (Pos._M_node)->_M_next;
        uVar5 = uVar5 + 1;
      } while (Pos._M_node != ScopeEnd->_M_node);
    }
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessRWTextureLoad(TokenListType::iterator&       Token,
                                                                    const TokenListType::iterator& ScopeEnd,
                                                                    Uint32                         ArrayDim)
{
    // RWTex[Location.xy]
    // ^

    // Find the last pair of square brackets, skipping texture array indexing
    auto OpenStapleToken    = Token;
    auto ClosingStapleToken = ScopeEnd;
    for (Uint32 ArrayIdx = 0; ArrayIdx < ArrayDim + 1; ++ArrayIdx)
    {
        ++OpenStapleToken;
        if (OpenStapleToken == ScopeEnd || OpenStapleToken->Type != TokenType::OpenSquareBracket)
            return false;

        ClosingStapleToken = Parsing::FindMatchingBracket(m_Tokens.begin(), ScopeEnd, OpenStapleToken);
        VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching closing square bracket");

        // RWTex[Location[idx].xy]
        //                       ^
        //              ClosingStapleToken
        VERIFY_EXPR(ClosingStapleToken->Type == TokenType::ClosingSquareBracket);

        if (ArrayIdx < ArrayDim)
        {
            OpenStapleToken = ClosingStapleToken;
            // RWTexArray[idx[0]][Location.xy]
            //                  ^
            //            OpenStapleToken
        }
    }
    //      RWTex[Location.xy]
    //           ^           ^
    //  OpenStaplePos     ClosingStaplePos

    m_Tokens.insert(Token, TokenInfo(TokenType::Identifier, "imageLoad", Token->Delimiter.c_str()));
    m_Tokens.insert(Token, TokenInfo(TokenType::OpenParen, "(", ""));
    Token->Delimiter = " ";
    // imageLoad( RWTex[Location.xy]
    //            ^    ^
    //        Token   OpenStaplePos

    m_Tokens.insert(OpenStapleToken, TokenInfo(TokenType::Comma, ",", ""));
    m_Tokens.insert(OpenStapleToken, TokenInfo(TokenType::Identifier, "_ToIvec", " "));
    // imageLoad( RWTex, _ToIvec[Location.xy]
    //                          ^
    //                       OpenStapleToken

    OpenStapleToken->Type    = TokenType::OpenParen;
    OpenStapleToken->Literal = "(";
    // imageLoad( RWTex, _ToIvec(Location.xy]
    //                          ^           ^
    //                 OpenStapleToken    ClosingStapleToken

    m_Tokens.insert(ClosingStapleToken, TokenInfo(TokenType::ClosingParen, ")", ""));
    // imageLoad( RWTex, _ToIvec(Location.xy)]
    //                                       ^
    //                                   ClosingStapleToken


    ClosingStapleToken->Type    = TokenType::ClosingParen;
    ClosingStapleToken->Literal = ")";
    // imageLoad( RWTex, _ToIvec(Location.xy))
    //                          ^
    //                      OpenStapleToken

    Token = OpenStapleToken;

    // Note that 'Location' may require further conversion

    return true;
}